

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O3

bool __thiscall
Js::ProbeContainer::GetNextUserStatementOffsetHelper
          (ProbeContainer *this,FunctionBody *functionBody,int currentOffset,
          StatementAdjustmentType adjType,int *nextStatementOffset)

{
  uint start;
  StatementMap *pSVar1;
  code *pcVar2;
  bool bVar3;
  StatementAdjustmentType SVar4;
  BOOL BVar5;
  uint uVar6;
  undefined4 *puVar7;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Type *pTVar8;
  StatementMap *pSVar9;
  undefined6 in_register_0000000a;
  int iVar10;
  int local_4c;
  uint *local_48;
  undefined4 local_3c;
  StatementAdjustmentRecord local_38;
  StatementAdjustmentRecord adjRecord;
  
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0x2e2,"(functionBody)","functionBody");
    if (!bVar3) goto LAB_008c81b2;
    *puVar7 = 0;
  }
  if (nextStatementOffset == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0x2e3,"(nextStatementOffset)","nextStatementOffset");
    if (!bVar3) {
LAB_008c81b2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  local_3c = (undefined4)CONCAT62(in_register_0000000a,adjType);
  local_48 = (uint *)nextStatementOffset;
  this_00 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)functionBody,StatementMaps);
  if ((this_00 !=
       (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)0x0) &&
     (1 < (this_00->
          super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>).
          count)) {
    iVar10 = 1;
    do {
      pTVar8 = JsUtil::
               List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_00,iVar10 + -1);
      pSVar1 = pTVar8->ptr;
      if ((pSVar1->isSubexpression == false) &&
         (bVar3 = regex::Interval::Includes(&pSVar1->byteCodeSpan,currentOffset), bVar3)) {
        local_4c = iVar10;
        pSVar9 = FunctionBody::
                 GetNextNonSubexpressionStatementMap<JsUtil::List<Js::FunctionBody::StatementMap*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>>
                           (this_00,&local_4c);
        if (pSVar9 != (StatementMap *)0x0) {
          FunctionBody::StatementAdjustmentRecord::StatementAdjustmentRecord(&local_38);
          uVar6 = (pSVar9->byteCodeSpan).begin;
          start = (pSVar1->byteCodeSpan).end;
          if (((int)start < (int)uVar6) &&
             (BVar5 = FunctionBody::GetBranchOffsetWithin(functionBody,start,uVar6,&local_38),
             BVar5 != 0)) {
            SVar4 = FunctionBody::StatementAdjustmentRecord::GetAdjustmentType(&local_38);
            if (((StatementAdjustmentType)local_3c & SVar4) != SAT_None) {
              uVar6 = FunctionBody::StatementAdjustmentRecord::GetByteCodeOffset(&local_38);
              if (uVar6 <= (uint)(pSVar1->byteCodeSpan).end) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                *puVar7 = 1;
                bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                            ,0x2fb,
                                            "(adjRecord.GetByteCodeOffset() > (uint)pStatementMap->byteCodeSpan.end)"
                                            ,
                                            "adjRecord.GetByteCodeOffset() > (uint)pStatementMap->byteCodeSpan.end"
                                           );
                if (!bVar3) goto LAB_008c81b2;
                *puVar7 = 0;
              }
              uVar6 = FunctionBody::StatementAdjustmentRecord::GetByteCodeOffset(&local_38);
              goto LAB_008c81a5;
            }
          }
          uVar6 = (pSVar9->byteCodeSpan).begin;
LAB_008c81a5:
          *local_48 = uVar6;
          return true;
        }
        break;
      }
      bVar3 = iVar10 < (this_00->
                       super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                       ).count + -1;
      iVar10 = iVar10 + 1;
    } while (bVar3);
  }
  *local_48 = 0xffffffff;
  return false;
}

Assistant:

bool ProbeContainer::GetNextUserStatementOffsetHelper(
        Js::FunctionBody* functionBody, int currentOffset, FunctionBody::StatementAdjustmentType adjType, int* nextStatementOffset)
    {
        Assert(functionBody);
        Assert(nextStatementOffset);

        FunctionBody::StatementMapList* pStatementMaps = functionBody->GetStatementMaps();
        if (pStatementMaps && pStatementMaps->Count() > 1)
        {
            for (int index = 0; index < pStatementMaps->Count() - 1; index++)
            {
                FunctionBody::StatementMap* pStatementMap = pStatementMaps->Item(index);

                if (!pStatementMap->isSubexpression && pStatementMap->byteCodeSpan.Includes(currentOffset))
                {
                    int nextMapIndex = index;
                    FunctionBody::StatementMap* pNextStatementMap = Js::FunctionBody::GetNextNonSubexpressionStatementMap(pStatementMaps, ++nextMapIndex);
                    if (!pNextStatementMap)
                    {
                        break;
                    }

                    // We are trying to find out the Branch opcode, between current and next statement. Skipping that would give use incorrect execution order.
                    FunctionBody::StatementAdjustmentRecord adjRecord;
                    if (pNextStatementMap->byteCodeSpan.begin > pStatementMap->byteCodeSpan.end &&
                        functionBody->GetBranchOffsetWithin(pStatementMap->byteCodeSpan.end, pNextStatementMap->byteCodeSpan.begin, &adjRecord) &&
                        (adjRecord.GetAdjustmentType() & adjType))
                    {
                        Assert(adjRecord.GetByteCodeOffset() > (uint)pStatementMap->byteCodeSpan.end);
                        *nextStatementOffset = adjRecord.GetByteCodeOffset();
                    }
                    else
                    {
                        *nextStatementOffset = pNextStatementMap->byteCodeSpan.begin;
                    }
                    return true;
                }
            }
        }

        *nextStatementOffset = -1;
        return false;
    }